

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<std::filesystem::__cxx11::path>::reallocateTo
          (SmallVectorBase<std::filesystem::__cxx11::path> *this,size_type newCapacity)

{
  path *__last;
  iterator ctx;
  path *in_RSI;
  SmallVectorBase<std::filesystem::__cxx11::path> *in_RDI;
  pointer newData;
  
  __last = (path *)operator_new(0x326e23);
  begin(in_RDI);
  ctx = end(in_RDI);
  std::uninitialized_move<std::filesystem::__cxx11::path*,std::filesystem::__cxx11::path*>
            (in_RSI,__last,(path *)in_RDI);
  cleanup(in_RDI,(EVP_PKEY_CTX *)ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }